

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::TextureStorage<3u,true>
          (StorageAndSubImageTest *this,GLenum target,GLuint texture,GLsizei levels,
          GLenum internalformat,GLsizei width,GLsizei height,GLsizei depth)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLsizei width_local;
  GLenum internalformat_local;
  GLsizei levels_local;
  GLuint texture_local;
  GLenum target_local;
  StorageAndSubImageTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1398))
            (target,levels,internalformat,width,height,depth);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glTexStorage3D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x759);
  return true;
}

Assistant:

bool StorageAndSubImageTest::TextureStorage<3, true>(glw::GLenum target, glw::GLuint texture, glw::GLsizei levels,
													 glw::GLenum internalformat, glw::GLsizei width,
													 glw::GLsizei height, glw::GLsizei depth)
{
	(void)texture;
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing storage. */
	gl.texStorage3D(target, levels, internalformat, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D has failed");

	/* TextureSubImage* (not TextureStorage*) is tested so here we only throw when error occurs. */
	return true;
}